

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

InsertOrderedMap<wasm::Type,_unsigned_int> * __thiscall
wasm::BinaryInstWriter::countScratchLocals
          (InsertOrderedMap<wasm::Type,_unsigned_int> *__return_storage_ptr__,BinaryInstWriter *this
          )

{
  Expression **ppEVar1;
  char *pcVar2;
  undefined1 auStack_2c8 [8];
  RefinementScanner refinementScanner;
  undefined1 auStack_168 [8];
  ScratchLocalFinder finder;
  
  finder.parent = (BinaryInstWriter *)&finder.scratches.Map._M_h._M_rehash_policy._M_next_resize;
  auStack_168 = (undefined1  [8])0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.replacep =
       (Expression **)0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.fixed._M_elems[9]
  .currp = (Expression **)0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.currFunction =
       (Function *)0x0;
  finder.scratches.Map._M_h._M_buckets = (__buckets_ptr)0x1;
  finder.scratches.Map._M_h._M_bucket_count = 0;
  finder.scratches.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  finder.scratches.Map._M_h._M_element_count._0_4_ = 0x3f800000;
  finder.scratches.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  finder.scratches.Map._M_h._M_rehash_policy._4_4_ = 0;
  finder.scratches.Map._M_h._M_rehash_policy._M_next_resize = 0;
  finder.scratches.Map._M_h._M_single_bucket =
       (__node_base_ptr)&finder.scratches.Map._M_h._M_single_bucket;
  finder.scratches.List.
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  finder.scratches.List.
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node._M_size._0_4_ = 0;
  finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.currModule =
       (Module *)this;
  finder.scratches.List.
  super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)finder.scratches.Map._M_h._M_single_bucket;
  Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::pushTask
            ((Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_> *)auStack_168,
             PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::scan,
             &this->func->body);
  do {
    if (((long)finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>
               .super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.
               flexible.
               super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>
               .super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.
               fixed._M_elems[9].currp >> 4) +
        (long)finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
              super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.replacep ==
        0) {
      if (((int)finder.scratches.List.
                super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                ._M_impl._M_node._M_size == 0) ||
         (((this->parent->wasm->features).features & 0x400) == 0)) {
        InsertOrderedMap<wasm::Type,_unsigned_int>::InsertOrderedMap
                  (__return_storage_ptr__,
                   (InsertOrderedMap<wasm::Type,_unsigned_int> *)&finder.parent);
      }
      else {
        auStack_2c8 = (undefined1  [8])0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.replacep =
             (Expression **)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        expressionStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        expressionStack.fixed._M_elems[9] = (Expression *)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        expressionStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.fixed.
        _M_elems[9].currp = (Expression **)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.currFunction =
             (Function *)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.currModule =
             (Module *)0x0;
        refinementScanner.
        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
        expressionStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)this;
        refinementScanner.writer = (BinaryInstWriter *)auStack_168;
        Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::pushTask
                  ((Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_> *)auStack_2c8
                   ,ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                    ::scan,&this->func->body);
        while( true ) {
          if (((long)refinementScanner.
                     super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                     .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                     super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               (long)refinementScanner.
                     super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                     .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                     super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.
                     fixed._M_elems[9].currp >> 4) +
              (long)refinementScanner.
                    super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                    .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                    super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                    replacep == 0) break;
          if ((pointer)refinementScanner.
                       super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                       .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                       .super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                       stack.fixed._M_elems[9].currp ==
              refinementScanner.
              super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
              .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
              super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.
              flexible.
              super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (refinementScanner.
                super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.replacep ==
                (Expression **)0x0) {
              pcVar2 = 
              "T &wasm::SmallVector<wasm::Walker<RefinementScanner, wasm::Visitor<RefinementScanner>>::Task, 10>::back() [T = wasm::Walker<RefinementScanner, wasm::Visitor<RefinementScanner>>::Task, N = 10]"
              ;
LAB_00cef2b7:
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar2);
            }
            ppEVar1 = refinementScanner.
                      super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                      .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                      super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack
                      .fixed._M_elems
                      [(long)refinementScanner.
                             super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                             .
                             super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                             .
                             super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                             .replacep + -2].currp;
            auStack_2c8 = (undefined1  [8])
                          refinementScanner.
                          super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                          .
                          super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                          .super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                          stack.fixed._M_elems
                          [(long)refinementScanner.
                                 super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                 .
                                 super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                 .
                                 super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                 .replacep + -1].func;
            refinementScanner.
            super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
            super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
            super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.replacep =
                 (Expression **)
                 ((long)refinementScanner.
                        super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                        .
                        super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                        .super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                        replacep + -1);
          }
          else {
            ppEVar1 = (Expression **)
                      refinementScanner.
                      super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                      .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                      super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack
                      .flexible.
                      super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].func;
            auStack_2c8 = (undefined1  [8])
                          refinementScanner.
                          super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                          .
                          super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                          .super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].currp;
            refinementScanner.
            super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
            super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
            super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 refinementScanner.
                 super_ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                 .super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.
                 super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          if (*(Expression **)auStack_2c8 == (Expression *)0x0) {
            pcVar2 = 
            "void wasm::Walker<RefinementScanner, wasm::Visitor<RefinementScanner>>::walk(Expression *&) [SubType = RefinementScanner, VisitorType = wasm::Visitor<RefinementScanner>]"
            ;
LAB_00cef298:
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar2);
          }
          (*(code *)ppEVar1)((RefinementScanner *)auStack_2c8,(Expression **)auStack_2c8);
        }
        InsertOrderedMap<wasm::Type,_unsigned_int>::InsertOrderedMap
                  (__return_storage_ptr__,
                   (InsertOrderedMap<wasm::Type,_unsigned_int> *)&finder.parent);
        ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::
        ~ExpressionStackWalker
                  ((ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                    *)auStack_2c8);
      }
      countScratchLocals::ScratchLocalFinder::~ScratchLocalFinder((ScratchLocalFinder *)auStack_168)
      ;
      return __return_storage_ptr__;
    }
    if ((pointer)finder.
                 super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                 super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.
                 fixed._M_elems[9].currp ==
        finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
        super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
          super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.replacep ==
          (Expression **)0x0) {
        pcVar2 = 
        "T &wasm::SmallVector<wasm::Walker<ScratchLocalFinder, wasm::Visitor<ScratchLocalFinder>>::Task, 10>::back() [T = wasm::Walker<ScratchLocalFinder, wasm::Visitor<ScratchLocalFinder>>::Task, N = 10]"
        ;
        goto LAB_00cef2b7;
      }
      ppEVar1 = finder.
                super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.
                fixed._M_elems
                [(long)finder.
                       super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>
                       .super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                       replacep + -2].currp;
      auStack_168 = (undefined1  [8])
                    finder.
                    super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                    super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack
                    .fixed._M_elems
                    [(long)finder.
                           super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>
                           .
                           super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>
                           .replacep + -1].func;
      finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
      super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.replacep =
           (Expression **)
           ((long)finder.
                  super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                  super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                  replacep + -1);
    }
    else {
      ppEVar1 = (Expression **)
                finder.
                super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.
                flexible.
                super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_168 = (undefined1  [8])
                    finder.
                    super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
                    super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack
                    .flexible.
                    super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
      super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           finder.super_PostWalker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.
           super_Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>.stack.flexible
           .
           super__Vector_base<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task,_std::allocator<wasm::Walker<ScratchLocalFinder,_wasm::Visitor<ScratchLocalFinder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_168 == (Expression *)0x0) {
      pcVar2 = 
      "void wasm::Walker<ScratchLocalFinder, wasm::Visitor<ScratchLocalFinder>>::walk(Expression *&) [SubType = ScratchLocalFinder, VisitorType = wasm::Visitor<ScratchLocalFinder>]"
      ;
      goto LAB_00cef298;
    }
    (*(code *)ppEVar1)((ScratchLocalFinder *)auStack_168,(Expression **)auStack_168);
  } while( true );
}

Assistant:

InsertOrderedMap<Type, Index> BinaryInstWriter::countScratchLocals() {
  struct ScratchLocalFinder : PostWalker<ScratchLocalFinder> {
    BinaryInstWriter& parent;
    InsertOrderedMap<Type, Index> scratches;

    ScratchLocalFinder(BinaryInstWriter& parent) : parent(parent) {}

    void visitTupleExtract(TupleExtract* curr) {
      if (curr->type == Type::unreachable) {
        // We will not emit this instruction anyway.
        return;
      }
      // Extracts from locals or globals are optimizable and do not require
      // scratch locals. Record them.
      auto* tuple = curr->tuple;
      if (tuple->is<LocalGet>() || tuple->is<LocalSet>() ||
          tuple->is<GlobalGet>()) {
        parent.extractedGets.insert({tuple, curr->index});
        return;
      }
      // Include a scratch register for each type of tuple.extract with nonzero
      // index present.
      if (curr->index != 0) {
        auto& count = scratches[curr->type];
        count = std::max(count, 1u);
      }
    }

    void visitStringWTF16Get(StringWTF16Get* curr) {
      if (curr->type == Type::unreachable) {
        return;
      }
      // If `pos` already a local.get, we can defer emitting that local.get
      // instead of using a scratch local.
      if (auto* get = curr->pos->dynCast<LocalGet>()) {
        parent.deferredGets.insert(get);
        return;
      }
      // Scratch local to hold the `pos` value while we emit a stringview
      // conversion for the `ref` value.
      auto& count = scratches[Type::i32];
      count = std::max(count, 1u);
    }

    void visitStringSliceWTF(StringSliceWTF* curr) {
      if (curr->type == Type::unreachable) {
        return;
      }
      // If `start` and `end` are already local.gets, we can defer emitting
      // those gets instead of using scratch locals.
      auto* startGet = curr->start->dynCast<LocalGet>();
      auto* endGet = curr->end->dynCast<LocalGet>();
      if (startGet && endGet) {
        parent.deferredGets.insert(startGet);
        parent.deferredGets.insert(endGet);
        return;
      }
      // Scratch locals to hold the `start` and `end` values while we emit a
      // stringview conversion for the `ref` value.
      auto& count = scratches[Type::i32];
      count = std::max(count, 2u);
    }

    // As mentioned in BinaryInstWriter::visitBreak, the type of br_if with a
    // value may be more refined in Binaryen IR compared to the wasm spec, as we
    // give it the type of the value, while the spec gives it the type of the
    // block it targets. To avoid problems we must handle the case where a br_if
    // has a value, the value is more refined then the target, and the value is
    // not dropped (the last condition is very rare in real-world wasm, making
    // all of this a quite unusual situation). First, detect such situations by
    // seeing if we have br_ifs that return reference types at all. We do so by
    // counting them, and as we go we ignore ones that are dropped, since a
    // dropped value is not a problem for us.
    //
    // Note that we do not check all the conditions here, such as if the type
    // matches the break target, or if the parent is a cast, which we leave for
    // a more expensive analysis later, which we only run if we see something
    // suspicious here.
    Index numDangerousBrIfs = 0;

    void visitBreak(Break* curr) {
      if (curr->type.hasRef()) {
        numDangerousBrIfs++;
      }
    }

    void visitDrop(Drop* curr) {
      if (curr->value->is<Break>() && curr->value->type.hasRef()) {
        // The value is exactly a br_if of a ref, that we just visited before
        // us. Undo the ++ from there as it can be ignored.
        assert(numDangerousBrIfs > 0);
        numDangerousBrIfs--;
      }
    }
  } finder(*this);
  finder.walk(func->body);

  if (!finder.numDangerousBrIfs || !parent.getModule()->features.hasGC()) {
    // Nothing more to do: either no such br_ifs, or GC is not enabled.
    //
    // The explicit check for GC is here because if only reference types are
    // enabled then we still may seem to need a fixup here, e.g. if a ref.func
    // is br_if'd to a block of type funcref. But that only appears that way
    // because in Binaryen IR we allow non-nullable types even without GC (and
    // if GC is not enabled then we always emit nullable types in the binary).
    // That is, even if we see a type difference without GC, it will vanish in
    // the binary format; there is never a need to add any ref.casts without GC
    // being enabled.
    return std::move(finder.scratches);
  }

  // There are dangerous-looking br_ifs, so we must do the harder work to
  // actually investigate them in detail, including tracking block types. By
  // being fully precise here, we'll only emit casts when absolutely necessary,
  // which avoids repeated roundtrips adding more and more code.
  struct RefinementScanner : public ExpressionStackWalker<RefinementScanner> {
    BinaryInstWriter& writer;
    ScratchLocalFinder& finder;

    RefinementScanner(BinaryInstWriter& writer, ScratchLocalFinder& finder)
      : writer(writer), finder(finder) {}

    void visitBreak(Break* curr) {
      // See if this is one of the dangerous br_ifs we must handle.
      if (!curr->type.hasRef()) {
        // Not even a reference.
        return;
      }
      auto* parent = getParent();
      if (parent) {
        if (parent->is<Drop>()) {
          // It is dropped anyhow.
          return;
        }
        if (auto* cast = parent->dynCast<RefCast>()) {
          if (Type::isSubType(cast->type, curr->type)) {
            // It is cast to the same type or a better one. In particular this
            // handles the case of repeated roundtripping: After the first
            // roundtrip we emit a cast that we'll identify here, and not emit
            // an additional one.
            return;
          }
        }
      }
      auto* breakTarget = findBreakTarget(curr->name);
      auto unrefinedType = breakTarget->type;
      if (unrefinedType == curr->type) {
        // It has the proper type anyhow.
        return;
      }

      // Mark the br_if as needing handling, and add the type to the set of
      // types we need scratch tuple locals for (if relevant).
      writer.brIfsNeedingHandling[curr] = unrefinedType;

      if (unrefinedType.isTuple()) {
        // We must allocate enough scratch locals for this tuple. Note that we
        // may need more than one per type in the tuple, if a type appears more
        // than once, so we count their appearances.
        InsertOrderedMap<Type, Index> scratchTypeUses;
        for (auto t : unrefinedType) {
          scratchTypeUses[t]++;
        }
        for (auto& [type, uses] : scratchTypeUses) {
          auto& count = finder.scratches[type];
          count = std::max(count, uses);
        }
      }
    }
  } refinementScanner(*this, finder);
  refinementScanner.walk(func->body);

  return std::move(finder.scratches);
}